

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

void init_builtins(Context_conflict *ctx)

{
  uint uVar1;
  MOJOSHADER_astDataType *pMVar2;
  char *pcVar3;
  int shader_model;
  MOJOSHADER_astDataType *dt;
  char local_a8 [4];
  int len;
  char buf [32];
  uint local_80;
  int k;
  int j;
  int i;
  anon_struct_16_2_7e7b00ca types [6];
  Context_conflict *ctx_local;
  
  _j = "bool";
  types[0].str = (char *)&(ctx->dt_bool).type;
  types[0].datatype = (MOJOSHADER_astDataType *)0x15b61d;
  types[1].str = (char *)&(ctx->dt_int).type;
  types[1].datatype = (MOJOSHADER_astDataType *)anon_var_dwarf_8d3;
  types[2].str = (char *)&(ctx->dt_uint).type;
  types[2].datatype = (MOJOSHADER_astDataType *)anon_var_dwarf_8ff;
  types[3].str = (char *)&(ctx->dt_half).type;
  types[3].datatype = (MOJOSHADER_astDataType *)0x15b627;
  types[4].str = (char *)&(ctx->dt_float).type;
  types[4].datatype = (MOJOSHADER_astDataType *)anon_var_dwarf_90a;
  types[5].str = (char *)&(ctx->dt_double).type;
  for (k = 0; (uint)k < 6; k = k + 1) {
    for (local_80 = 1; (int)local_80 < 5; local_80 = local_80 + 1) {
      pMVar2 = new_datatype_vector(ctx,(MOJOSHADER_astDataType *)types[k].str,local_80);
      uVar1 = snprintf(local_a8,0x20,"%s%d",*(undefined8 *)(&j + (long)k * 4),(ulong)local_80);
      pcVar3 = stringcache_len(ctx->strcache,local_a8,uVar1);
      push_usertype(ctx,pcVar3,pMVar2);
      buf[0x1c] = '\x01';
      buf[0x1d] = '\0';
      buf[0x1e] = '\0';
      buf[0x1f] = '\0';
      for (; (int)buf._28_4_ < 5; buf._28_4_ = buf._28_4_ + 1) {
        pMVar2 = new_datatype_matrix(ctx,(MOJOSHADER_astDataType *)types[k].str,local_80,buf._28_4_)
        ;
        uVar1 = snprintf(local_a8,0x20,"%s%dx%d",*(undefined8 *)(&j + (long)k * 4),(ulong)local_80,
                         (ulong)(uint)buf._28_4_);
        pcVar3 = stringcache_len(ctx->strcache,local_a8,uVar1);
        push_usertype(ctx,pcVar3,pMVar2);
      }
    }
  }
  pcVar3 = stringcache(ctx->strcache,"abs");
  add_intrinsic_SAME1_ANYfi(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"acos");
  add_intrinsic_SAME1_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"all");
  add_intrinsic_BOOL_ANYfib(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"any");
  add_intrinsic_BOOL_ANYfib(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"asin");
  add_intrinsic_SAME1_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"atan");
  add_intrinsic_SAME1_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"atan2");
  add_intrinsic_SAME1_ANYf_SAME1(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"ceil");
  add_intrinsic_SAME1_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"clamp");
  add_intrinsic_SAME1_ANYfi_SAME1_SAME1(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"clip");
  add_intrinsic_VOID_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"cos");
  add_intrinsic_SAME1_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"cosh");
  add_intrinsic_SAME1_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"cross");
  add_intrinsic_3f_3f_3f(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"D3DCOLORtoUBYTE4");
  add_intrinsic_4i_4f(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"distance");
  add_intrinsic_f_Vf_SAME1(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"degrees");
  add_intrinsic_SAME1_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"determinant");
  add_intrinsic_f_SQUAREMATRIXf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"dot");
  add_intrinsic_fi_Vfi_SAME1(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"exp");
  add_intrinsic_SAME1_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"exp2");
  add_intrinsic_SAME1_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"faceforward");
  add_intrinsic_SAME1_Vf_SAME1_SAME1(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"floor");
  add_intrinsic_SAME1_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"fmod");
  add_intrinsic_SAME1_ANYf_SAME1(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"frac");
  add_intrinsic_SAME1_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"isfinite");
  add_intrinsic_BOOL_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"isinf");
  add_intrinsic_BOOL_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"isnan");
  add_intrinsic_BOOL_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"ldexp");
  add_intrinsic_SAME1_ANYf_SAME1(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"length");
  add_intrinsic_f_Vf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"lerp");
  add_intrinsic_SAME1_ANYf_SAME1_SAME1(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"lit");
  add_intrinsic_4f_f_f_f(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"log");
  add_intrinsic_SAME1_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"log10");
  add_intrinsic_SAME1_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"log2");
  add_intrinsic_SAME1_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"max");
  add_intrinsic_SAME1_ANYfi_SAME1(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"min");
  add_intrinsic_SAME1_ANYfi_SAME1(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"modf");
  add_intrinsic_SAME1_ANYfi_SAME1(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"mul");
  add_intrinsic_mul(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"noise");
  add_intrinsic_f_Vf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"normalize");
  add_intrinsic_SAME1_Vf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"pow");
  add_intrinsic_SAME1_ANYf_SAME1(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"radians");
  add_intrinsic_SAME1_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"reflect");
  add_intrinsic_SAME1_ANYfi_SAME1(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"refract");
  add_intrinsic_SAME1_Vf_SAME1_f(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"round");
  add_intrinsic_SAME1_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"rsqrt");
  add_intrinsic_SAME1_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"saturate");
  add_intrinsic_SAME1_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"sign");
  add_intrinsic_SAME1_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"sin");
  add_intrinsic_SAME1_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"sincos");
  add_intrinsic_VOID_ANYf_SAME1_SAME1(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"sinh");
  add_intrinsic_SAME1_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"smoothstep");
  add_intrinsic_SAME1_ANYf_SAME1_SAME1(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"sqrt");
  add_intrinsic_SAME1_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"step");
  add_intrinsic_SAME1_ANYf_SAME1(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"tan");
  add_intrinsic_SAME1_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"tanh");
  add_intrinsic_SAME1_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"tex1D");
  add_intrinsic_4f_s1_f(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"tex2D");
  add_intrinsic_4f_s2_2f(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"tex3D");
  add_intrinsic_4f_s3_3f(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"texCUBE");
  add_intrinsic_4f_sc_3f(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"transpose");
  add_intrinsic_SAME1_Mfib(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"trunc");
  add_intrinsic_SAME1_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"ddx");
  add_intrinsic_SAME1_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"ddy");
  add_intrinsic_SAME1_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"frexp");
  add_intrinsic_SAME1_ANYf_SAME1(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"fwidth");
  add_intrinsic_SAME1_ANYf(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"tex1D");
  add_intrinsic_4f_s1_f_f_f(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"tex1Dbias");
  add_intrinsic_4f_s1_4f(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"tex1Dgrad");
  add_intrinsic_4f_s1_f_f_f(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"tex1Dproj");
  add_intrinsic_4f_s1_4f(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"tex2D");
  add_intrinsic_4f_s2_2f_2f_2f(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"tex2Dbias");
  add_intrinsic_4f_s2_4f(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"tex2Dgrad");
  add_intrinsic_4f_s2_2f_2f_2f(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"tex2Dproj");
  add_intrinsic_4f_s2_4f(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"tex3D");
  add_intrinsic_4f_s3_3f_3f_3f(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"tex3Dbias");
  add_intrinsic_4f_s3_4f(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"tex3Dgrad");
  add_intrinsic_4f_s3_3f_3f_3f(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"tex3Dproj");
  add_intrinsic_4f_s3_4f(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"texCUBE");
  add_intrinsic_4f_sc_3f_3f_3f(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"texCUBEbias");
  add_intrinsic_4f_sc_4f(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"texCUBEgrad");
  add_intrinsic_4f_sc_3f_3f_3f(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"texCUBEproj");
  add_intrinsic_4f_sc_4f(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"tex1Dlod");
  add_intrinsic_4f_s1_4f(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"tex2Dlod");
  add_intrinsic_4f_s2_4f(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"tex3Dlod");
  add_intrinsic_4f_s3_4f(ctx,pcVar3);
  pcVar3 = stringcache(ctx->strcache,"texCUBElod");
  add_intrinsic_4f_sc_4f(ctx,pcVar3);
  return;
}

Assistant:

static void init_builtins(Context *ctx)
{
    // add in standard typedefs...
    const struct
    {
        const char *str;
        const MOJOSHADER_astDataType *datatype;
    } types[] = {
        { "bool", &ctx->dt_bool },
        { "int", &ctx->dt_int },
        { "uint", &ctx->dt_uint },
        { "half", &ctx->dt_half },
        { "float", &ctx->dt_float },
        { "double", &ctx->dt_double },
    };

    int i, j, k;
    for (i = 0; i < STATICARRAYLEN(types); i++)
    {
        char buf[32];
        int len;
        const MOJOSHADER_astDataType *dt;

        for (j = 1; j <= 4; j++)
        {
            // "float2"
            dt = new_datatype_vector(ctx, types[i].datatype, j);
            len = snprintf(buf, sizeof (buf), "%s%d", types[i].str, j);
            push_usertype(ctx, stringcache_len(ctx->strcache, buf, len), dt);
            for (k = 1; k <= 4; k++)
            {
                // "float2x2"
                dt = new_datatype_matrix(ctx, types[i].datatype, j, k);
                len = snprintf(buf, sizeof (buf), "%s%dx%d", types[i].str,j,k);
                push_usertype(ctx, stringcache_len(ctx->strcache,buf,len), dt);
            } // for
        } // for
    } // for

    // !!! FIXME: block these out by pixel/vertex/etc shader.
    // !!! FIXME: calculate actual shader model (or maybe just let bytecode verifier throw up?).
    const int shader_model = 3;
    if (shader_model >= 1)
    {
        add_intrinsic_SAME1_ANYfi(ctx, stringcache(ctx->strcache, "abs"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "acos"));
        add_intrinsic_BOOL_ANYfib(ctx, stringcache(ctx->strcache, "all"));
        add_intrinsic_BOOL_ANYfib(ctx, stringcache(ctx->strcache, "any"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "asin"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "atan"));
        add_intrinsic_SAME1_ANYf_SAME1(ctx, stringcache(ctx->strcache, "atan2"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "ceil"));
        add_intrinsic_SAME1_ANYfi_SAME1_SAME1(ctx, stringcache(ctx->strcache, "clamp"));
        add_intrinsic_VOID_ANYf(ctx, stringcache(ctx->strcache, "clip"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "cos"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "cosh"));
        add_intrinsic_3f_3f_3f(ctx, stringcache(ctx->strcache, "cross"));
        add_intrinsic_4i_4f(ctx, stringcache(ctx->strcache, "D3DCOLORtoUBYTE4"));
        add_intrinsic_f_Vf_SAME1(ctx, stringcache(ctx->strcache, "distance"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "degrees"));
        add_intrinsic_f_SQUAREMATRIXf(ctx, stringcache(ctx->strcache, "determinant"));
        add_intrinsic_fi_Vfi_SAME1(ctx, stringcache(ctx->strcache, "dot"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "exp"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "exp2"));
        add_intrinsic_SAME1_Vf_SAME1_SAME1(ctx, stringcache(ctx->strcache, "faceforward"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "floor"));
        add_intrinsic_SAME1_ANYf_SAME1(ctx, stringcache(ctx->strcache, "fmod"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "frac"));
        add_intrinsic_BOOL_ANYf(ctx, stringcache(ctx->strcache, "isfinite"));
        add_intrinsic_BOOL_ANYf(ctx, stringcache(ctx->strcache, "isinf"));
        add_intrinsic_BOOL_ANYf(ctx, stringcache(ctx->strcache, "isnan"));
        add_intrinsic_SAME1_ANYf_SAME1(ctx, stringcache(ctx->strcache, "ldexp"));
        add_intrinsic_f_Vf(ctx, stringcache(ctx->strcache, "length"));
        add_intrinsic_SAME1_ANYf_SAME1_SAME1(ctx, stringcache(ctx->strcache, "lerp"));
        add_intrinsic_4f_f_f_f(ctx, stringcache(ctx->strcache, "lit"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "log"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "log10"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "log2"));
        add_intrinsic_SAME1_ANYfi_SAME1(ctx, stringcache(ctx->strcache, "max"));
        add_intrinsic_SAME1_ANYfi_SAME1(ctx, stringcache(ctx->strcache, "min"));
        add_intrinsic_SAME1_ANYfi_SAME1(ctx, stringcache(ctx->strcache, "modf"));  // !!! FIXME: out var?
        add_intrinsic_mul(ctx, stringcache(ctx->strcache, "mul"));
        add_intrinsic_f_Vf(ctx, stringcache(ctx->strcache, "noise"));
        add_intrinsic_SAME1_Vf(ctx, stringcache(ctx->strcache, "normalize"));
        add_intrinsic_SAME1_ANYf_SAME1(ctx, stringcache(ctx->strcache, "pow"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "radians"));
        add_intrinsic_SAME1_ANYfi_SAME1(ctx, stringcache(ctx->strcache, "reflect"));
        add_intrinsic_SAME1_Vf_SAME1_f(ctx, stringcache(ctx->strcache, "refract"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "round"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "rsqrt"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "saturate"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "sign"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "sin"));
        add_intrinsic_VOID_ANYf_SAME1_SAME1(ctx, stringcache(ctx->strcache, "sincos"));  // !!! FIXME: out var?
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "sinh"));
        add_intrinsic_SAME1_ANYf_SAME1_SAME1(ctx, stringcache(ctx->strcache, "smoothstep"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "sqrt"));
        add_intrinsic_SAME1_ANYf_SAME1(ctx, stringcache(ctx->strcache, "step"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "tan"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "tanh"));
        add_intrinsic_4f_s1_f(ctx, stringcache(ctx->strcache, "tex1D"));
        add_intrinsic_4f_s2_2f(ctx, stringcache(ctx->strcache, "tex2D"));
        add_intrinsic_4f_s3_3f(ctx, stringcache(ctx->strcache, "tex3D"));
        add_intrinsic_4f_sc_3f(ctx, stringcache(ctx->strcache, "texCUBE"));
        add_intrinsic_SAME1_Mfib(ctx, stringcache(ctx->strcache, "transpose"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "trunc"));
    } // if

    if (shader_model >= 2)
    {
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "ddx"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "ddy"));
        add_intrinsic_SAME1_ANYf_SAME1(ctx, stringcache(ctx->strcache, "frexp"));
        add_intrinsic_SAME1_ANYf(ctx, stringcache(ctx->strcache, "fwidth"));
        add_intrinsic_4f_s1_f_f_f(ctx, stringcache(ctx->strcache, "tex1D"));
        add_intrinsic_4f_s1_4f(ctx, stringcache(ctx->strcache, "tex1Dbias"));
        add_intrinsic_4f_s1_f_f_f(ctx, stringcache(ctx->strcache, "tex1Dgrad"));
        add_intrinsic_4f_s1_4f(ctx, stringcache(ctx->strcache, "tex1Dproj"));
        add_intrinsic_4f_s2_2f_2f_2f(ctx, stringcache(ctx->strcache, "tex2D"));
        add_intrinsic_4f_s2_4f(ctx, stringcache(ctx->strcache, "tex2Dbias"));
        add_intrinsic_4f_s2_2f_2f_2f(ctx, stringcache(ctx->strcache, "tex2Dgrad"));
        add_intrinsic_4f_s2_4f(ctx, stringcache(ctx->strcache, "tex2Dproj"));
        add_intrinsic_4f_s3_3f_3f_3f(ctx, stringcache(ctx->strcache, "tex3D"));
        add_intrinsic_4f_s3_4f(ctx, stringcache(ctx->strcache, "tex3Dbias"));
        add_intrinsic_4f_s3_3f_3f_3f(ctx, stringcache(ctx->strcache, "tex3Dgrad"));
        add_intrinsic_4f_s3_4f(ctx, stringcache(ctx->strcache, "tex3Dproj"));
        add_intrinsic_4f_sc_3f_3f_3f(ctx, stringcache(ctx->strcache, "texCUBE"));
        add_intrinsic_4f_sc_4f(ctx, stringcache(ctx->strcache, "texCUBEbias"));
        add_intrinsic_4f_sc_3f_3f_3f(ctx, stringcache(ctx->strcache, "texCUBEgrad"));
        add_intrinsic_4f_sc_4f(ctx, stringcache(ctx->strcache, "texCUBEproj"));
    } // if

    if (shader_model >= 3)
    {
        add_intrinsic_4f_s1_4f(ctx, stringcache(ctx->strcache, "tex1Dlod"));
        add_intrinsic_4f_s2_4f(ctx, stringcache(ctx->strcache, "tex2Dlod"));
        add_intrinsic_4f_s3_4f(ctx, stringcache(ctx->strcache, "tex3Dlod"));
        add_intrinsic_4f_sc_4f(ctx, stringcache(ctx->strcache, "texCUBElod"));
    } // if
}